

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void run_test(wstring_view *text,value *expected)

{
  version ver;
  type s;
  wostream *pwVar1;
  value *v;
  value *v_00;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_3b0;
  int local_39c;
  wstring local_398 [4];
  int used_now;
  wstring_view local_378;
  wstring local_368;
  wstring local_348 [2];
  exception *e_1;
  function<void_(const_mjs::statement_&,_const_mjs::completion_&)> local_2c8;
  interpreter local_2a8;
  interpreter i;
  value res;
  anon_class_24_3_46a01442 pb;
  wostringstream error_stream;
  exception *e;
  shared_ptr<mjs::source_file> local_b0;
  unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> local_a0;
  undefined1 local_98 [8];
  unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> bs;
  gc_heap h;
  uint32_t num_slots;
  value *expected_local;
  wstring_view *text_local;
  
  bVar2 = false;
  if ((run_test_func != (char *)0x0) && (bVar2 = false, run_test_file != (char *)0x0)) {
    bVar2 = run_test_line != 0;
  }
  if (!bVar2) {
    __assert_fail("run_test_func && run_test_file && run_test_line",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test.cpp",0x1a
                  ,"void run_test(const std::wstring_view &, const value &)");
  }
  mjs::gc_heap::gc_heap((gc_heap *)&bs,run_test::storage,0x200000);
  std::unique_ptr<mjs::block_statement,std::default_delete<mjs::block_statement>>::
  unique_ptr<std::default_delete<mjs::block_statement>,void>
            ((unique_ptr<mjs::block_statement,std::default_delete<mjs::block_statement>> *)local_98)
  ;
  tested_version();
  std::
  make_shared<mjs::source_file,wchar_t_const(&)[5],std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&,mjs::version>
            ((wchar_t (*) [5])&local_b0,
             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)0x22252c,(version *)text);
  mjs::parse((mjs *)&local_a0,&local_b0,non_strict);
  std::unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_>::operator=
            ((unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> *)
             local_98,&local_a0);
  std::unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_>::~unique_ptr
            (&local_a0);
  std::shared_ptr<mjs::source_file>::~shared_ptr(&local_b0);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&pb.bs);
  res.field_1._24_8_ = &pb.bs;
  pb.text = (wstring_view *)local_98;
  pb.error_stream = (wostringstream *)text;
  mjs::value::value((value *)&i);
  ver = tested_version();
  std::function<void_(const_mjs::statement_&,_const_mjs::completion_&)>::function(&local_2c8);
  mjs::interpreter::interpreter(&local_2a8,(gc_heap *)&bs,ver,&local_2c8);
  std::function<void_(const_mjs::statement_&,_const_mjs::completion_&)>::~function(&local_2c8);
  s = std::unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_>::operator*
                ((unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> *)
                 local_98);
  mjs::interpreter::eval((value *)&e_1,&local_2a8,&s->super_statement);
  mjs::value::operator=((value *)&i,(value *)&e_1);
  mjs::value::~value((value *)&e_1);
  mjs::interpreter::~interpreter(&local_2a8);
  bVar2 = mjs::operator!=((value *)&i,expected);
  if (bVar2) {
    run_test::anon_class_24_3_46a01442::operator()
              ((anon_class_24_3_46a01442 *)
               &res.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                super_gc_heap_ptr_untyped.pos_);
    pwVar1 = std::operator<<((wostream *)&pb.bs,"Expecting ");
    mjs::debug_string_abi_cxx11_(local_348,(mjs *)expected,v);
    pwVar1 = std::operator<<(pwVar1,(wstring *)local_348);
    pwVar1 = std::operator<<(pwVar1," got ");
    mjs::debug_string_abi_cxx11_(&local_368,(mjs *)&i,v_00);
    pwVar1 = std::operator<<(pwVar1,(wstring *)&local_368);
    std::operator<<(pwVar1,"\n");
    std::__cxx11::wstring::~wstring((wstring *)&local_368);
    std::__cxx11::wstring::~wstring((wstring *)local_348);
    std::__cxx11::wostringstream::str();
    local_378 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_398);
    mjs::throw_runtime_error
              (&local_378,
               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test.cpp",0x56);
  }
  mjs::value::~value((value *)&i);
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&pb.bs);
  std::unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_>::~unique_ptr
            ((unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> *)
             local_98);
  mjs::gc_heap::garbage_collect((gc_heap *)&bs);
  local_39c = mjs::gc_heap::use_percentage((gc_heap *)&bs);
  if (local_39c != 0) {
    pwVar1 = std::operator<<((wostream *)&std::wcout,"Leaks! Used now: ");
    std::wostream::operator<<(pwVar1,local_39c);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3b0,"Leaks");
    mjs::throw_runtime_error
              (&local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test.cpp",0x5e);
  }
  mjs::gc_heap::~gc_heap((gc_heap *)&bs);
  return;
}

Assistant:

void run_test(const std::wstring_view& text, const value& expected) {
    assert(run_test_func && run_test_file && run_test_line);

    // Use local heap, even if expected lives in another heap
    constexpr uint32_t num_slots = 1<<21;
#ifndef MJS_GC_STRESS_TEST
    // Re-use storage unless we're stress testing
    static uint64_t storage[num_slots];
    gc_heap h{storage, num_slots};
#else
    gc_heap h{num_slots};
#endif

    {
        decltype(parse(nullptr)) bs;
        try {
            bs = parse(std::make_shared<source_file>(L"test", text, tested_version()));
        } catch (const std::exception& e) {
            std::wcout << "Parse failed for \"" << text << "\": " << e.what() <<  "\n";
            throw;
        }
        std::wostringstream error_stream;
        auto pb = [&]() {
            const char * start = "----------------\n";
            const char * end = "----------------\n\n";

            error_stream << "\n";
            error_stream << run_test_file << ":" << run_test_line << " in " << run_test_func << ":\n";

            error_stream << "Test failure in:\n";
            error_stream << start;
            error_stream << text << "\n";
            error_stream << end;

            error_stream << "Parsed as:\n";
            error_stream << start;
            for (const auto& s: bs->l()) {
                error_stream << *s << "\n\n";
            }
            error_stream << end;

            error_stream << "Pretty printed:\n";
            error_stream << start;
            print(error_stream, *bs);
            error_stream << "\n";
            error_stream << end;

            error_stream << "\n";
        };
        value res;
        try {
            interpreter i{h, tested_version()};
            res = i.eval(*bs);
        } catch (const std::exception& e) {
            pb();
            error_stream << "Unexpected exception thrown: " << e.what() << "\n";
            THROW_RUNTIME_ERROR(error_stream.str());
        }
        if (res != expected) {
            pb();
            error_stream << "Expecting " << debug_string(expected) << " got " << debug_string(res) << "\n";
            THROW_RUNTIME_ERROR(error_stream.str());
        }
    }

    h.garbage_collect();
    const auto used_now = h.use_percentage();
    if (used_now) {
        std::wcout << "Leaks! Used now: " << used_now;
        THROW_RUNTIME_ERROR("Leaks");
    }
}